

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  undefined8 uVar1;
  TestError *pTVar2;
  string *local_8d8;
  string *local_8c0;
  string *local_7e0;
  string local_740 [8];
  string temp;
  size_t max_dimension_index_2;
  size_t swap_item;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string shader_source;
  string local_6b8 [39];
  allocator<char> local_691;
  string local_690 [32];
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [39];
  allocator<char> local_621;
  string local_620 [32];
  string local_600 [39];
  allocator<char> local_5d9;
  string local_5d8 [39];
  allocator<char> local_5b1;
  string local_5b0 [32];
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [32];
  string local_520 [39];
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  string local_4d0 [32];
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  string local_440 [39];
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [32];
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [32];
  string local_360 [32];
  ulong local_340;
  size_t max_dimension_index_1;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  ulong local_2d0;
  size_t max_dimension_index;
  string full_variable_names [8];
  allocator<char> local_1b8;
  allocator<char> local_1b7;
  allocator<char> local_1b6;
  allocator<char> local_1b5;
  allocator<char> local_1b4;
  allocator<char> local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  string *local_1b0;
  string local_1a8 [8];
  string variable_basenames [8];
  string local_a0 [8];
  string base_variable_string;
  string local_78 [8];
  string example_struct2;
  allocator<char> local_41;
  string local_40 [8];
  string example_struct1;
  size_t dimension_index;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  example_struct1.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"\nvoid my_function(",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,")\n{\n}\n\n",
             (allocator<char> *)(base_variable_string.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(base_variable_string.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_a0);
  local_1b0 = local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"v1",&local_1b1);
  local_1b0 = (string *)(variable_basenames[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[0].field_2._M_local_buf + 8),"v2",&local_1b2);
  local_1b0 = (string *)(variable_basenames[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[1].field_2._M_local_buf + 8),"v3",&local_1b3);
  local_1b0 = (string *)(variable_basenames[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[2].field_2._M_local_buf + 8),"v4",&local_1b4);
  local_1b0 = (string *)(variable_basenames[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[3].field_2._M_local_buf + 8),"v5",&local_1b5);
  local_1b0 = (string *)(variable_basenames[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[4].field_2._M_local_buf + 8),"v6",&local_1b6);
  local_1b0 = (string *)(variable_basenames[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[5].field_2._M_local_buf + 8),"v7",&local_1b7);
  local_1b0 = (string *)(variable_basenames[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames[6].field_2._M_local_buf + 8),"v8",&local_1b8);
  std::allocator<char>::~allocator(&local_1b8);
  std::allocator<char>::~allocator(&local_1b7);
  std::allocator<char>::~allocator(&local_1b6);
  std::allocator<char>::~allocator(&local_1b5);
  std::allocator<char>::~allocator(&local_1b4);
  std::allocator<char>::~allocator(&local_1b3);
  std::allocator<char>::~allocator(&local_1b2);
  std::allocator<char>::~allocator(&local_1b1);
  local_7e0 = (string *)&max_dimension_index;
  do {
    std::__cxx11::string::string(local_7e0);
    local_7e0 = local_7e0 + 0x20;
  } while (local_7e0 != (string *)((long)&full_variable_names[7].field_2 + 8));
  for (local_2d0 = 0; local_2d0 < 8; local_2d0 = local_2d0 + 1) {
    std::__cxx11::string::string
              (local_310,(string *)(variable_basenames[local_2d0 - 1].field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_330,"[2]",(allocator<char> *)((long)&max_dimension_index_1 + 7));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_2f0,this,local_310,local_330,local_2d0 + 1);
    std::__cxx11::string::operator=
              ((string *)(full_variable_names[local_2d0 - 1].field_2._M_local_buf + 8),local_2f0);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)((long)&max_dimension_index_1 + 7));
    std::__cxx11::string::~string(local_310);
  }
  for (local_340 = 0; local_340 < 8; local_340 = local_340 + 1) {
    std::__cxx11::string::operator+=(local_a0,"float ");
    std::__cxx11::string::operator+=
              (local_a0,(string *)(full_variable_names[local_340 - 1].field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=(local_a0,";\n");
  }
  std::__cxx11::string::operator+=(local_a0,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_380,"float a",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a8,"[2]",&local_3a9);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_360,this,local_380,local_3a8,1);
  std::__cxx11::string::operator+=(local_a0,local_360);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"float b",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"[2]",&local_419);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_3d0,this,local_3f0,local_418,2);
  std::__cxx11::string::operator+=(local_a0,local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"float c",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_488,"[2]",&local_489);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_440,this,local_460,local_488,3);
  std::__cxx11::string::operator+=(local_a0,local_440);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"float d",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"[2]",&local_4f9);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_4b0,this,local_4d0,local_4f8,4);
  std::__cxx11::string::operator+=(local_a0,local_4b0);
  std::__cxx11::string::~string(local_4b0);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_540,"float e",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_568,"[2]",&local_569);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_520,this,local_540,local_568,5);
  std::__cxx11::string::operator+=(local_a0,local_520);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5b0,"float f",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"[2]",&local_5d9);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_590,this,local_5b0,local_5d8,6);
  std::__cxx11::string::operator+=(local_a0,local_590);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_620,"float g",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"[2]",&local_649);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_600,this,local_620,local_648,7);
  std::__cxx11::string::operator+=(local_a0,local_600);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::operator+=(local_a0,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_690,"float h",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,"[2]",(allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_670,this,local_690,local_6b8,8);
  std::__cxx11::string::operator+=(local_a0,local_670);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::operator+=(local_a0,local_78);
  std::__cxx11::string::string((string *)&cs,local_a0);
  std::__cxx11::string::operator+=((string *)&cs,(string *)shader_start_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)&cs,"    my_function(");
  for (example_struct1.field_2._8_8_ = 0; (ulong)example_struct1.field_2._8_8_ < 7;
      example_struct1.field_2._8_8_ = example_struct1.field_2._8_8_ + 1) {
    std::__cxx11::string::operator+=
              ((string *)&cs,
               (string *)
               (variable_basenames[example_struct1.field_2._8_8_ + -1].field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)&cs,", ");
  }
  std::__cxx11::string::operator+=
            ((string *)&cs,
             (string *)
             (variable_basenames[example_struct1.field_2._8_8_ + -1].field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)&cs,");\n");
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case COMPUTE_SHADER_TYPE:
    break;
  case GEOMETRY_SHADER_TYPE:
    std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x6b9);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
  vs = (string *)empty_string_abi_cxx11_;
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  tes = (string *)default_tc_shader_source_abi_cxx11_;
  gs = (string *)default_te_shader_source_abi_cxx11_;
  fs = (string *)default_geometry_shader_source_abi_cxx11_;
  swap_item = (size_t)default_fragment_shader_source_abi_cxx11_;
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    swap_item = (size_t)&cs;
    break;
  case VERTEX_SHADER_TYPE:
    tcs = (string *)&cs;
    break;
  case COMPUTE_SHADER_TYPE:
    vs = (string *)&cs;
    tcs = (string *)empty_string_abi_cxx11_;
    tes = (string *)empty_string_abi_cxx11_;
    gs = (string *)empty_string_abi_cxx11_;
    fs = (string *)empty_string_abi_cxx11_;
    swap_item = (size_t)empty_string_abi_cxx11_;
    break;
  case GEOMETRY_SHADER_TYPE:
    fs = (string *)&cs;
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    tes = (string *)&cs;
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    gs = (string *)&cs;
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x6bc);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs,tes,gs,fs,swap_item,vs,1,0);
  for (max_dimension_index_2 = 1; uVar1 = max_dimension_index_2, max_dimension_index_2 < 8;
      max_dimension_index_2 = max_dimension_index_2 + 1) {
    while (temp.field_2._8_8_ = uVar1 + 1, (ulong)temp.field_2._8_8_ < 8) {
      std::__cxx11::string::string
                (local_740,
                 (string *)(variable_basenames[max_dimension_index_2 - 1].field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::operator=((string *)&cs,local_a0);
      std::__cxx11::string::operator=
                ((string *)(variable_basenames[max_dimension_index_2 - 1].field_2._M_local_buf + 8),
                 (string *)(variable_basenames[temp.field_2._8_8_ + -1].field_2._M_local_buf + 8));
      std::__cxx11::string::operator=
                ((string *)(variable_basenames[temp.field_2._8_8_ + -1].field_2._M_local_buf + 8),
                 local_740);
      std::__cxx11::string::operator+=((string *)&cs,(string *)shader_start_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)&cs,"    my_function(");
      for (example_struct1.field_2._8_8_ = 0; (ulong)example_struct1.field_2._8_8_ < 7;
          example_struct1.field_2._8_8_ = example_struct1.field_2._8_8_ + 1) {
        std::__cxx11::string::operator+=
                  ((string *)&cs,
                   (string *)
                   (variable_basenames[example_struct1.field_2._8_8_ + -1].field_2._M_local_buf + 8)
                  );
        std::__cxx11::string::operator+=((string *)&cs,", ");
      }
      std::__cxx11::string::operator+=
                ((string *)&cs,
                 (string *)
                 (variable_basenames[example_struct1.field_2._8_8_ + -1].field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)&cs,");\n");
      std::__cxx11::string::operator=
                (local_740,
                 (string *)(variable_basenames[max_dimension_index_2 - 1].field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::operator=
                ((string *)(variable_basenames[max_dimension_index_2 - 1].field_2._M_local_buf + 8),
                 (string *)(variable_basenames[temp.field_2._8_8_ + -1].field_2._M_local_buf + 8));
      std::__cxx11::string::operator=
                ((string *)(variable_basenames[temp.field_2._8_8_ + -1].field_2._M_local_buf + 8),
                 local_740);
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
        break;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      default:
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x6e1);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(this,(ulong)tested_shader_type,&cs);
      std::__cxx11::string::~string(local_740);
      uVar1 = temp.field_2._8_8_;
    }
  }
  std::__cxx11::string::~string((string *)&cs);
  local_8c0 = (string *)(full_variable_names[7].field_2._M_local_buf + 8);
  do {
    local_8c0 = local_8c0 + -0x20;
    std::__cxx11::string::~string(local_8c0);
  } while (local_8c0 != (string *)&max_dimension_index);
  local_8d8 = (string *)(variable_basenames[7].field_2._M_local_buf + 8);
  do {
    local_8d8 = local_8d8 + -0x20;
    std::__cxx11::string::~string(local_8d8);
  } while (local_8d8 != local_1a8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void SizedDeclarationsFunctionParams<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	size_t		dimension_index = 0;
	std::string example_struct1("\nvoid my_function(");
	std::string example_struct2(")\n"
								"{\n"
								"}\n\n");
	std::string base_variable_string;
	std::string variable_basenames[API::MAX_ARRAY_DIMENSIONS] = { "v1", "v2", "v3", "v4", "v5", "v6", "v7", "v8" };
	std::string full_variable_names[API::MAX_ARRAY_DIMENSIONS];

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		full_variable_names[max_dimension_index] =
			this->extend_string(variable_basenames[max_dimension_index], "[2]", max_dimension_index + 1);
	}

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		base_variable_string += "float ";
		base_variable_string += full_variable_names[max_dimension_index];
		base_variable_string += ";\n";
	}

	base_variable_string += example_struct1;
	base_variable_string += this->extend_string("float a", "[2]", 1);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float b", "[2]", 2);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float c", "[2]", 3);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float d", "[2]", 4);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float e", "[2]", 5);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float f", "[2]", 6);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float g", "[2]", 7);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float h", "[2]", 8);
	base_variable_string += example_struct2;

	std::string shader_source = base_variable_string;

	shader_source += shader_start;
	shader_source += "    my_function(";

	for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
	{
		shader_source += variable_basenames[dimension_index];
		shader_source += ", ";
	}

	shader_source += variable_basenames[dimension_index];
	shader_source += ");\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	/* Only the previous case should succeed, so start from index 1 rather than 0.
	 * The other cases should fail, so only compile them, rather than trying to also link them.
	 * We'll swap items 2/3, then 2/4, then 2/5, then 2/6, ...
	 * Then we'll swap items 3/4, then 3/5, ...
	 * Repeat, starting for 4/5-8, 5/6-8, 6/7-8...
	 * Finally, we'll swap items 7/8
	 */
	for (size_t swap_item = 1; swap_item < API::MAX_ARRAY_DIMENSIONS; swap_item++)
	{
		for (size_t max_dimension_index = swap_item + 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS;
			 max_dimension_index++)
		{
			std::string temp = variable_basenames[swap_item];

			shader_source							= base_variable_string;
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			shader_source += shader_start;
			shader_source += "    my_function(";

			for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
			{
				shader_source += variable_basenames[dimension_index];
				shader_source += ", ";
			}

			shader_source += variable_basenames[dimension_index];
			shader_source += ");\n";

			temp									= variable_basenames[swap_item];
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* for (int max_dimension_index = swap_item + 1; ...) */
	}	 /* for (int swap_item = 1; ...) */
}